

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

void __thiscall BackwardPass::ProcessInlineeEnd(BackwardPass *this,Instr *instr)

{
  Opnd *pOVar1;
  _func_int **pp_Var2;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  InlineeFrameInfo *pIVar3;
  ArgList *pAVar4;
  Type pIVar5;
  code *pcVar6;
  bool bVar7;
  OpndKind OVar8;
  Func *curFunc;
  StackSym *pSVar9;
  undefined4 *puVar10;
  JITTimeFunctionBody *this_01;
  Func *pFVar11;
  long lVar12;
  Instr *pIVar13;
  Instr *pIVar14;
  long lVar15;
  anon_class_8_1_dda845c3 iterator;
  
  if (this->currentPrePassLoop == (Loop *)0x0) {
    if (this->tag == DeadStorePhase) {
      this_01 = JITTimeWorkItem::GetJITFunctionBody(instr->m_func->m_workItem);
      bVar7 = JITTimeFunctionBody::UsesArgumentsObject(this_01);
      if ((bVar7) && (bVar7 = Func::IsStackArgsEnabled(instr->m_func), !bVar7)) {
        pFVar11 = instr->m_func;
        do {
          *(uint *)&pFVar11->field_0x240 = *(uint *)&pFVar11->field_0x240 & 0xfffff7fd;
          pFVar11->frameInfo = (InlineeFrameInfo *)0x0;
          pFVar11 = pFVar11->parentFunc;
        } while (pFVar11 != (Func *)0x0);
      }
      if ((instr->m_func->field_0x240 & 2) != 0) {
        if (instr->m_func->frameInfo == (InlineeFrameInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x2079,"(instr->m_func->frameInfo)","instr->m_func->frameInfo");
          if (!bVar7) goto LAB_003ea582;
          *puVar10 = 0;
        }
        pIVar3 = instr->m_func->frameInfo;
        pAVar4 = pIVar3->arguments;
        if (0 < (pAVar4->
                super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>
                ).count) {
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          lVar12 = 0;
          lVar15 = 0;
          do {
            pIVar5 = (pAVar4->
                     super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>
                     ).buffer;
            if (*(int *)((long)&pIVar5->type + lVar12) == 1) {
              BVSparse<Memory::JitArenaAllocator>::Set
                        (this->currentBlock->upwardExposedUses,
                         *(BVIndex *)(*(long *)((long)&pIVar5->field_1 + lVar12) + 0x10));
            }
            if (*(int *)((long)&pIVar5->type + lVar12) == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar10 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.h"
                                 ,0xaf,"(value.type != InlineeFrameInfoValueType_None)",
                                 "value.type != InlineeFrameInfoValueType_None");
              if (!bVar7) goto LAB_003ea582;
              *puVar10 = 0;
            }
            lVar15 = lVar15 + 1;
            lVar12 = lVar12 + 0x18;
          } while (lVar15 < (pAVar4->
                            super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>
                            ).count);
        }
        if ((pIVar3->function).type == InlineeFrameInfoValueType_None) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.h"
                             ,0xbf,"(function.type != InlineeFrameInfoValueType_None)",
                             "function.type != InlineeFrameInfoValueType_None");
          if (!bVar7) goto LAB_003ea582;
          *puVar10 = 0;
        }
        if ((pIVar3->function).type == InlineeFrameInfoValueType_Sym) {
          BVSparse<Memory::JitArenaAllocator>::Set
                    (this->currentBlock->upwardExposedUses,
                     (((pIVar3->function).field_1.sym)->super_Sym).m_id);
          return;
        }
      }
    }
    else if (this->tag == BackwardPhase) {
      pSVar9 = IR::Opnd::GetStackSym(instr->m_src2);
      if (((pSVar9->field_0x18 & 1) == 0) || ((pSVar9->field_5).m_instrDef == (Instr *)0x0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
        if (!bVar7) {
LAB_003ea582:
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
        *puVar10 = 0;
      }
      pIVar13 = (pSVar9->field_5).m_instrDef;
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        if ((pIVar13->m_src2 == (Opnd *)0x0) ||
           (OVar8 = IR::Opnd::GetKind(pIVar13->m_src2), OVar8 != OpndKindSym)) {
LAB_003ea293:
          pIVar14 = (Instr *)0x0;
        }
        else {
          pOVar1 = pIVar13->m_src2;
          OVar8 = IR::Opnd::GetKind(pOVar1);
          if (OVar8 != OpndKindSym) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar10 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
            if (!bVar7) goto LAB_003ea582;
            *puVar10 = 0;
          }
          pp_Var2 = pOVar1[1]._vptr_Opnd;
          if (*(char *)((long)pp_Var2 + 0x14) != '\x01') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar10 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                               ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
            if (!bVar7) goto LAB_003ea582;
            *puVar10 = 0;
          }
          if (((*(byte *)((long)pp_Var2 + 0x1a) & 0x10) != 0) &&
             (*(short *)((long)pp_Var2 + 0x16) == 0)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar10 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                               ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
            if (!bVar7) goto LAB_003ea582;
            *puVar10 = 0;
          }
          if ((*(byte *)((long)pp_Var2 + 0x1a) & 0x10) == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar10 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                               ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
            if (!bVar7) goto LAB_003ea582;
            *puVar10 = 0;
          }
          if ((((((ulong)pp_Var2[3] & 1) == 0) || (pp_Var2[5] == (_func_int *)0x0)) &&
              (bVar7 = Func::IsInPhase(instr->m_func,FGPeepsPhase), !bVar7)) &&
             (bVar7 = Func::IsInPhase(instr->m_func,FGBuildPhase), !bVar7)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar10 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                               ,0x1bf,
                               "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                               ,
                               "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                              );
            if (!bVar7) goto LAB_003ea582;
            *puVar10 = 0;
          }
          if (((ulong)pp_Var2[3] & 1) == 0) goto LAB_003ea293;
          pIVar14 = (Instr *)pp_Var2[5];
        }
        if (pIVar13->m_opcode != ArgOut_A_InlineSpecialized) {
          if (pIVar13->m_opcode == StartCall) {
            if (pIVar14 == (Instr *)0x0) {
              return;
            }
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar10 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                               ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
            if (bVar7) {
              *puVar10 = 0;
              return;
            }
            goto LAB_003ea582;
          }
          OVar8 = IR::Opnd::GetKind(pIVar13->m_src1);
          if (OVar8 == OpndKindReg) {
            this_00 = this->currentBlock->upwardExposedUses;
            pOVar1 = pIVar13->m_src1;
            OVar8 = IR::Opnd::GetKind(pOVar1);
            if (OVar8 != OpndKindReg) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar10 = 1;
              bVar7 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                 ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
              if (!bVar7) goto LAB_003ea582;
              *puVar10 = 0;
            }
            BVSparse<Memory::JitArenaAllocator>::Set(this_00,*(BVIndex *)(pOVar1[1]._vptr_Opnd + 2))
            ;
          }
        }
        pIVar13 = pIVar14;
      } while (pIVar14 != (Instr *)0x0);
    }
  }
  return;
}

Assistant:

void
BackwardPass::ProcessInlineeEnd(IR::Instr* instr)
{
    if (this->IsPrePass())
    {
        return;
    }
    if (this->tag == Js::BackwardPhase)
    {
        // Commenting out to allow for argument length and argument[constant] optimization
        // Will revisit in phase two
        /*if (!GlobOpt::DoInlineArgsOpt(instr->m_func))
        {
            return;
        }*/

        // This adds a use for function sym as part of InlineeStart & all the syms referenced by the args.
        // It ensure they do not get cleared from the copy prop sym map.
        instr->IterateArgInstrs([=](IR::Instr* argInstr){
            if (argInstr->GetSrc1()->IsRegOpnd())
            {
                this->currentBlock->upwardExposedUses->Set(argInstr->GetSrc1()->AsRegOpnd()->m_sym->m_id);
            }
            return false;
        });
    }
    else if (this->tag == Js::DeadStorePhase)
    {
        if (instr->m_func->GetJITFunctionBody()->UsesArgumentsObject() && !instr->m_func->IsStackArgsEnabled())
        {
            instr->m_func->DisableCanDoInlineArgOpt();
        }

        if (instr->m_func->m_hasInlineArgsOpt)
        {
            Assert(instr->m_func->frameInfo);
            instr->m_func->frameInfo->IterateSyms([=](StackSym* argSym)
            {
                this->currentBlock->upwardExposedUses->Set(argSym->m_id);
            });
        }
    }
}